

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetPropertyIdFromSymbol(JsValueRef symbol,JsPropertyIdRef *propertyId)

{
  anon_class_16_2_bf42ae51 fn;
  JsErrorCode JVar1;
  JsPropertyIdRef *local_18;
  JsPropertyIdRef *propertyId_local;
  JsValueRef symbol_local;
  
  fn.propertyId = &local_18;
  fn.symbol = &propertyId_local;
  local_18 = propertyId;
  propertyId_local = (JsPropertyIdRef *)symbol;
  JVar1 = ContextAPINoScriptWrapper<JsGetPropertyIdFromSymbol::__0>(fn,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetPropertyIdFromSymbol(_In_ JsValueRef symbol, _Out_ JsPropertyIdRef *propertyId)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetPropertyIdFromSymbol, symbol);

        VALIDATE_INCOMING_REFERENCE(symbol, scriptContext);
        PARAM_NOT_NULL(propertyId);
        *propertyId = nullptr;

        if (!Js::VarIs<Js::JavascriptSymbol>(symbol))
        {
            return JsErrorPropertyNotSymbol;
        }

        *propertyId = (JsPropertyIdRef)Js::VarTo<Js::JavascriptSymbol>(symbol)->GetValue();
        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}